

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int qpdfjob_run_from_wide_argv(wchar_t **argv)

{
  int iVar1;
  anon_class_8_1_89897dde local_38;
  function<int_(_qpdfjob_handle_*)> local_30;
  wchar_t **local_10;
  wchar_t **argv_local;
  
  local_38.argv = argv;
  local_10 = argv;
  std::function<int(_qpdfjob_handle*)>::function<qpdfjob_run_from_wide_argv::__0,void>
            ((function<int(_qpdfjob_handle*)> *)&local_30,&local_38);
  iVar1 = run_with_handle(&local_30);
  std::function<int_(_qpdfjob_handle_*)>::~function(&local_30);
  return iVar1;
}

Assistant:

int
qpdfjob_run_from_wide_argv(wchar_t const* const argv[])
{
    return run_with_handle(
        [argv](qpdfjob_handle j) { return qpdfjob_initialize_from_wide_argv(j, argv); });
}